

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

uint __thiscall
ON_3dPointListRef::GetMeshNgonPoints
          (ON_3dPointListRef *this,ON_MeshNgon *mesh_ngon,ON_SimpleArray<ON_3dPoint> *ngon_points)

{
  uint uVar1;
  
  if (((mesh_ngon != (ON_MeshNgon *)0x0) && ((ulong)mesh_ngon->m_Vcount != 0)) &&
     (mesh_ngon->m_vi != (uint *)0x0)) {
    ON_SimpleArray<ON_3dPoint>::Reserve(ngon_points,(ulong)mesh_ngon->m_Vcount);
    uVar1 = mesh_ngon->m_Vcount;
    if ((-1 < (int)uVar1) && ((int)uVar1 <= ngon_points->m_capacity)) {
      ngon_points->m_count = uVar1;
    }
    uVar1 = GetPoints(this,uVar1,mesh_ngon->m_vi,ngon_points->m_a);
    return uVar1;
  }
  if (-1 < ngon_points->m_capacity) {
    ngon_points->m_count = 0;
  }
  return 0;
}

Assistant:

unsigned int ON_3dPointListRef::GetMeshNgonPoints(
  const class ON_MeshNgon* mesh_ngon,
  ON_SimpleArray<ON_3dPoint>& ngon_points
  ) const
{
  if ( mesh_ngon && mesh_ngon->m_Vcount > 0 && 0 != mesh_ngon->m_vi )
  {
    ngon_points.Reserve(mesh_ngon->m_Vcount);
    ngon_points.SetCount(mesh_ngon->m_Vcount);
    return GetPoints(mesh_ngon->m_Vcount, mesh_ngon->m_vi, ngon_points.Array());
  }
  ngon_points.SetCount(0);
  return 0;
}